

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::SchemaElementDecl> **objToLoad,int initSize,bool toAdopt,
               XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *manager;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *pBVar2;
  XSerializeEngine *manager_00;
  SchemaElementDecl *pSVar3;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar4;
  XMLSize_t XVar5;
  XMLSize_t vectorLength;
  XMLSize_t local_38;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    pBVar2 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
    if (pBVar2 == (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      pBVar2 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
               XMemory::operator_new(0x30,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      XVar5 = 0x10;
      if (-1 < initSize) {
        XVar5 = (XMLSize_t)(uint)initSize;
      }
      BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::BaseRefVectorOf
                (pBVar2,XVar5,toAdopt,(MemoryManager *)manager_00);
      pBVar2->_vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004097f8;
      *objToLoad = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)pBVar2;
    }
    XSerializeEngine::registerObject(serEng,pBVar2);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar4 = 0;
      __buf = extraout_RDX;
      do {
        pSVar3 = (SchemaElementDecl *)
                 XSerializeEngine::read(serEng,0x439a60,__buf,(size_t)manager_00);
        pBVar2 = &(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
        BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar2,1);
        XVar5 = pBVar2->fCurCount;
        manager_00 = (XSerializeEngine *)pBVar2->fElemList;
        *(SchemaElementDecl **)((long)&manager_00->fStoreLoad + XVar5 * 8) = pSVar3;
        pBVar2->fCurCount = XVar5 + 1;
        uVar4 = uVar4 + 1;
        __buf = extraout_RDX_00;
      } while (uVar4 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<SchemaElementDecl>** objToLoad
                                   , int                              initSize
                                   , bool                             toAdopt
                                   , XSerializeEngine&                serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<SchemaElementDecl>(
                                                            initSize
                                                          , toAdopt
                                                          , serEng.getMemoryManager()
                                                          );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            SchemaElementDecl* data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}